

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void AppendDictionary<char[6]>(cmXMLWriter *xml,char *key,char (*value) [6])

{
  allocator local_39;
  string local_38;
  char *local_18;
  
  local_18 = key;
  std::__cxx11::string::string((string *)&local_38,"dictionary",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"key",&local_39);
  cmXMLWriter::Element<char_const*>(xml,&local_38,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"value",&local_39);
  cmXMLWriter::Element<char[6]>(xml,&local_38,value);
  std::__cxx11::string::~string((string *)&local_38);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void AppendDictionary(cmXMLWriter& xml, const char* key, T const& value)
{
  xml.StartElement("dictionary");
  xml.Element("key", key);
  xml.Element("value", value);
  xml.EndElement();
}